

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::scale(double sx,double sy,double sz)

{
  Transform *in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  Mat4x4 *mat;
  Mat4x4 mi;
  Mat4x4 m;
  Mat4x4 *invMat;
  Transform *this;
  _Mat4x4 local_118;
  _Mat4x4 local_98;
  double local_18;
  double local_10;
  double local_8;
  
  local_10 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_18 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  local_8 = in_XMM0_Qa;
  _Mat4x4::_Mat4x4(&local_98,in_XMM0_Qa,0.0,0.0,0.0,0.0,local_10,0.0,0.0,0.0,0.0,local_18,0.0,0.0,
                   0.0,0.0,1.0);
  mat = (Mat4x4 *)(1.0 / local_18);
  invMat = (Mat4x4 *)0x0;
  this = (Transform *)0x0;
  _Mat4x4::_Mat4x4(&local_118,1.0 / local_8,0.0,0.0,0.0,0.0,1.0 / local_10,0.0,0.0,0.0,0.0,
                   (double)mat,0.0,0.0,0.0,0.0,1.0);
  Transform(this,mat,invMat);
  return in_RDI;
}

Assistant:

Transform Transform::scale(Real sx, Real sy, Real sz) {
    Mat4x4 m = Mat4x4(sx,  0,  0, 0,
                       0, sy,  0, 0,
                       0,  0, sz, 0,
                       0,  0,  0, 1);
    Mat4x4 mi = Mat4x4(1 / sx,      0,      0, 0,
                            0, 1 / sy,      0, 0,
                            0,      0, 1 / sz, 0,
                            0,      0,      0, 1);
    return Transform(m, mi);
}